

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O1

int getSubsamp(j_decompress_ptr dinfo)

{
  uint uVar1;
  int iVar2;
  jpeg_component_info *pjVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  
  uVar1 = dinfo->num_components;
  if (((ulong)uVar1 != 1) || (iVar14 = 3, dinfo->jpeg_color_space != JCS_GRAYSCALE)) {
    iVar9 = uVar1 - 1;
    lVar10 = (ulong)uVar1 * 0x60 + -0x60;
    iVar14 = -1;
    lVar11 = 0;
    do {
      if ((uVar1 == pixelsize[lVar11]) ||
         (((uVar1 == 4 && (lVar11 != 3)) && ((dinfo->jpeg_color_space & ~JCS_GRAYSCALE) == JCS_CMYK)
          ))) {
        pjVar3 = dinfo->comp_info;
        iVar2 = pjVar3->h_samp_factor;
        iVar7 = tjMCUWidth[lVar11];
        iVar12 = iVar7 + 7;
        if (-1 < iVar7) {
          iVar12 = iVar7;
        }
        iVar12 = iVar12 >> 3;
        iVar7 = (int)lVar11;
        if (iVar2 == iVar12) {
          iVar13 = tjMCUHeight[lVar11];
          iVar5 = iVar13 + 7;
          if (-1 < iVar13) {
            iVar5 = iVar13;
          }
          if (pjVar3->v_samp_factor == iVar5 >> 3) {
            iVar13 = 0;
            if (1 < (int)uVar1) {
              lVar8 = 0;
              iVar13 = 0;
              do {
                if (dinfo->jpeg_color_space == JCS_YCCK) {
                  iVar4 = 1;
                  iVar6 = 1;
                  if (lVar8 == 0xc0) {
LAB_0010c805:
                    iVar4 = iVar12;
                    iVar6 = iVar5 >> 3;
                  }
                }
                else {
                  iVar4 = 1;
                  iVar6 = 1;
                  if (lVar8 == 0xc0 && dinfo->jpeg_color_space == JCS_CMYK) goto LAB_0010c805;
                }
                if (*(int *)((long)&pjVar3[1].h_samp_factor + lVar8) == iVar4) {
                  iVar13 = iVar13 + (uint)(*(int *)((long)&pjVar3[1].v_samp_factor + lVar8) == iVar6
                                          );
                }
                lVar8 = lVar8 + 0x60;
              } while (lVar10 != lVar8);
            }
            if (iVar13 == iVar9) {
              return iVar7;
            }
          }
        }
        if (((iVar2 == 2) && (pjVar3->v_samp_factor == 2)) && ((iVar7 == 4 || (iVar7 == 1)))) {
          iVar13 = 0;
          if (1 < (int)uVar1) {
            iVar13 = tjMCUHeight[lVar11];
            iVar5 = iVar13 + 7;
            if (-1 < iVar13) {
              iVar5 = iVar13;
            }
            lVar8 = 0;
            iVar13 = 0;
            do {
              iVar4 = iVar5 >> 3;
              iVar6 = iVar12;
              if (dinfo->jpeg_color_space == JCS_YCCK) {
                if (lVar8 == 0xc0) {
LAB_0010c8cc:
                  iVar4 = 2;
                  iVar6 = 2;
                }
              }
              else if (lVar8 == 0xc0 && dinfo->jpeg_color_space == JCS_CMYK) goto LAB_0010c8cc;
              if (*(int *)((long)&pjVar3[1].h_samp_factor + lVar8) == iVar4) {
                iVar13 = iVar13 + (uint)(*(int *)((long)&pjVar3[1].v_samp_factor + lVar8) == iVar6);
              }
              lVar8 = lVar8 + 0x60;
            } while (lVar10 != lVar8);
          }
          if (iVar13 == iVar9) {
            return iVar7;
          }
        }
        if ((lVar11 == 0 && 1 < (int)uVar1) &&
            pjVar3->v_samp_factor * iVar2 <= (int)(10 / (long)pixelsize[lVar11])) {
          lVar8 = 0;
          iVar7 = 0;
          do {
            if (*(int *)((long)&pjVar3[1].h_samp_factor + lVar8) == iVar2) {
              iVar7 = iVar7 + (uint)(*(int *)((long)&pjVar3[1].v_samp_factor + lVar8) ==
                                    pjVar3->v_samp_factor);
            }
            if (iVar7 == iVar9) {
              iVar14 = 0;
              break;
            }
            lVar8 = lVar8 + 0x60;
          } while (lVar10 != lVar8);
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 6);
  }
  return iVar14;
}

Assistant:

static int getSubsamp(j_decompress_ptr dinfo)
{
  int retval = -1, i, k;

  /* The sampling factors actually have no meaning with grayscale JPEG files,
     and in fact it's possible to generate grayscale JPEGs with sampling
     factors > 1 (even though those sampling factors are ignored by the
     decompressor.)  Thus, we need to treat grayscale as a special case. */
  if (dinfo->num_components == 1 && dinfo->jpeg_color_space == JCS_GRAYSCALE)
    return TJSAMP_GRAY;

  for (i = 0; i < NUMSUBOPT; i++) {
    if (dinfo->num_components == pixelsize[i] ||
        ((dinfo->jpeg_color_space == JCS_YCCK ||
          dinfo->jpeg_color_space == JCS_CMYK) &&
         pixelsize[i] == 3 && dinfo->num_components == 4)) {
      if (dinfo->comp_info[0].h_samp_factor == tjMCUWidth[i] / 8 &&
          dinfo->comp_info[0].v_samp_factor == tjMCUHeight[i] / 8) {
        int match = 0;

        for (k = 1; k < dinfo->num_components; k++) {
          int href = 1, vref = 1;

          if ((dinfo->jpeg_color_space == JCS_YCCK ||
               dinfo->jpeg_color_space == JCS_CMYK) && k == 3) {
            href = tjMCUWidth[i] / 8;  vref = tjMCUHeight[i] / 8;
          }
          if (dinfo->comp_info[k].h_samp_factor == href &&
              dinfo->comp_info[k].v_samp_factor == vref)
            match++;
        }
        if (match == dinfo->num_components - 1) {
          retval = i;  break;
        }
      }
      /* Handle 4:2:2 and 4:4:0 images whose sampling factors are specified
         in non-standard ways. */
      if (dinfo->comp_info[0].h_samp_factor == 2 &&
          dinfo->comp_info[0].v_samp_factor == 2 &&
          (i == TJSAMP_422 || i == TJSAMP_440)) {
        int match = 0;

        for (k = 1; k < dinfo->num_components; k++) {
          int href = tjMCUHeight[i] / 8, vref = tjMCUWidth[i] / 8;

          if ((dinfo->jpeg_color_space == JCS_YCCK ||
               dinfo->jpeg_color_space == JCS_CMYK) && k == 3) {
            href = vref = 2;
          }
          if (dinfo->comp_info[k].h_samp_factor == href &&
              dinfo->comp_info[k].v_samp_factor == vref)
            match++;
        }
        if (match == dinfo->num_components - 1) {
          retval = i;  break;
        }
      }
      /* Handle 4:4:4 images whose sampling factors are specified in
         non-standard ways. */
      if (dinfo->comp_info[0].h_samp_factor *
          dinfo->comp_info[0].v_samp_factor <=
          D_MAX_BLOCKS_IN_MCU / pixelsize[i] && i == TJSAMP_444) {
        int match = 0;
        for (k = 1; k < dinfo->num_components; k++) {
          if (dinfo->comp_info[k].h_samp_factor ==
              dinfo->comp_info[0].h_samp_factor &&
              dinfo->comp_info[k].v_samp_factor ==
              dinfo->comp_info[0].v_samp_factor)
            match++;
          if (match == dinfo->num_components - 1) {
            retval = i;  break;
          }
        }
      }
    }
  }
  return retval;
}